

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  void *fd_ctx_00;
  int64_t pts;
  int i;
  void *fd_ctx;
  FdInputContext in;
  FdOutContext out;
  char **argv_local;
  int argc_local;
  
  iVar1 = parse_opt_open_file(argc,argv);
  if (iVar1 == 0) {
    fd_ctx_00 = hevc_fast_dec_create((FdInputContext *)&fd_ctx);
    divide_nalus();
    au_buf[au_pos] = buf_size;
    for (pts._4_4_ = 0; pts._4_4_ < au_pos; pts._4_4_ = pts._4_4_ + 1) {
      hevc_fast_dec_decode
                (buf + au_buf[(int)pts._4_4_],au_buf[(int)(pts._4_4_ + 1)] - au_buf[(int)pts._4_4_],
                 (long)(int)(pts._4_4_ * 0x28),fd_ctx_00,(FdOutContext *)&in);
    }
    hevc_fast_dec_free(fd_ctx_00);
    free(buf);
    argv_local._4_4_ = 0;
  }
  else {
    argv_local._4_4_ = -1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char * const *argv)
{
    FdOutContext out;
    FdInputContext in;
    if(parse_opt_open_file(argc, argv))
        return -1;

    void *fd_ctx = hevc_fast_dec_create(&in);
    divide_nalus();

    au_buf[au_pos] = buf_size;
//    for(int i = 0; i <= au_pos; i++)
//        printf("%d\n", au_buf[i]);
    for(int i = 0; i < au_pos; i++)
    {
        int64_t pts = i * 40; //25fps
        hevc_fast_dec_decode(buf + au_buf[i], au_buf[i + 1] - au_buf[i], pts, fd_ctx, &out);
        if(out.got_frame)
        {
            //render
        }
    }



    hevc_fast_dec_free(fd_ctx);
    free(buf);
    return 0;
}